

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

void __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::add_to_nonfull(basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
                 *this,db_leaf_unique_ptr *child,tree_depth_type depth,uint8_t children_count_)

{
  long lVar1;
  long *plVar2;
  byte bVar3;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *ptr_;
  uint uVar4;
  uintptr_t uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  if (this->field_0x20 != children_count_) {
    __assert_fail("this->children_count == children_count_",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x896,
                  "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  if (children_count_ < 0x11) {
    __assert_fail("children_count_ >= parent_class::min_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x897,
                  "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  if (0x2f < children_count_) {
    __assert_fail("children_count_ < parent_class::capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x898,
                  "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  bVar3 = ((child->_M_t).
           super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
           .
           super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
          ._M_head_impl)->data[depth.value];
  if ((this->child_indexes)._M_elems[bVar3].value.super___atomic_base<unsigned_char>._M_i == 0xff) {
    uVar6 = 0xfffffff0;
    uVar8 = 3;
    do {
      plVar2 = (long *)((long)&this->children + (ulong)(uVar8 - 3) * 0x20);
      auVar9._0_8_ = -(ulong)(*plVar2 == 0);
      auVar9._8_8_ = -(ulong)(plVar2[1] == 0);
      auVar9._16_8_ = -(ulong)(plVar2[2] == 0);
      auVar9._24_8_ = -(ulong)(plVar2[3] == 0);
      plVar2 = (long *)((long)&this->children + (ulong)(uVar8 - 2) * 0x20);
      auVar10._0_8_ = -(ulong)(*plVar2 == 0);
      auVar10._8_8_ = -(ulong)(plVar2[1] == 0);
      auVar10._16_8_ = -(ulong)(plVar2[2] == 0);
      auVar10._24_8_ = -(ulong)(plVar2[3] == 0);
      auVar9 = vpackssdw_avx2(auVar9,auVar10);
      plVar2 = (long *)((long)&this->children + (ulong)(uVar8 - 1) * 0x20);
      auVar11._0_8_ = -(ulong)(*plVar2 == 0);
      auVar11._8_8_ = -(ulong)(plVar2[1] == 0);
      auVar11._16_8_ = -(ulong)(plVar2[2] == 0);
      auVar11._24_8_ = -(ulong)(plVar2[3] == 0);
      plVar2 = (long *)((long)&this->children + (ulong)uVar8 * 0x20);
      auVar12._0_8_ = -(ulong)(*plVar2 == 0);
      auVar12._8_8_ = -(ulong)(plVar2[1] == 0);
      auVar12._16_8_ = -(ulong)(plVar2[2] == 0);
      auVar12._24_8_ = -(ulong)(plVar2[3] == 0);
      auVar10 = vpackssdw_avx2(auVar11,auVar12);
      auVar11 = vpackssdw_avx2(auVar9,auVar10);
      uVar6 = uVar6 + 0x10;
      uVar8 = uVar8 + 4;
    } while (auVar11 == (undefined1  [32])0x0);
    if (0x2f < uVar6) {
      __assert_fail("i < parent_class::capacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x900,
                    "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                   );
    }
    auVar9 = vpermq_avx2(auVar9,0xd8);
    auVar10 = vpermq_avx2(auVar10,0xd8);
    auVar9 = vpackssdw_avx2(auVar9,auVar10);
    auVar9 = vpermq_avx2(auVar9,0xd8);
    uVar4 = (uint)(SUB321(auVar9 >> 7,0) & 1) | (uint)(SUB321(auVar9 >> 0xf,0) & 1) << 1 |
            (uint)(SUB321(auVar9 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar9 >> 0x1f,0) & 1) << 3 |
            (uint)(SUB321(auVar9 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar9 >> 0x2f,0) & 1) << 5 |
            (uint)(SUB321(auVar9 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar9 >> 0x3f,0) & 1) << 7 |
            (uint)(SUB321(auVar9 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar9 >> 0x4f,0) & 1) << 9 |
            (uint)(SUB321(auVar9 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar9 >> 0x5f,0) & 1) << 0xb
            | (uint)(SUB321(auVar9 >> 0x67,0) & 1) << 0xc |
            (uint)(SUB321(auVar9 >> 0x6f,0) & 1) << 0xd |
            (uint)(SUB321(auVar9 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar9 >> 0x7f,0) << 0xf |
            (uint)(SUB321(auVar9 >> 0x87,0) & 1) << 0x10 |
            (uint)(SUB321(auVar9 >> 0x8f,0) & 1) << 0x11 |
            (uint)(SUB321(auVar9 >> 0x97,0) & 1) << 0x12 |
            (uint)(SUB321(auVar9 >> 0x9f,0) & 1) << 0x13 |
            (uint)(SUB321(auVar9 >> 0xa7,0) & 1) << 0x14 |
            (uint)(SUB321(auVar9 >> 0xaf,0) & 1) << 0x15 |
            (uint)(SUB321(auVar9 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar9 >> 0xbf,0) << 0x17 |
            (uint)(SUB321(auVar9 >> 199,0) & 1) << 0x18 |
            (uint)(SUB321(auVar9 >> 0xcf,0) & 1) << 0x19 |
            (uint)(SUB321(auVar9 >> 0xd7,0) & 1) << 0x1a |
            (uint)(SUB321(auVar9 >> 0xdf,0) & 1) << 0x1b |
            (uint)(SUB321(auVar9 >> 0xe7,0) & 1) << 0x1c |
            (uint)(SUB321(auVar9 >> 0xef,0) & 1) << 0x1d |
            (uint)(SUB321(auVar9 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar9[0x1f] >> 7) << 0x1f;
    uVar8 = 0;
    if (uVar4 != 0) {
      for (; (uVar4 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    uVar6 = (uVar8 >> 1) + uVar6;
    if (*(long *)((long)&this->children + (ulong)uVar6 * 8) == 0) {
      uVar7 = 0;
      do {
        if (uVar6 == uVar7) {
          (this->child_indexes)._M_elems[bVar3].value.super___atomic_base<unsigned_char>._M_i =
               (__int_type_conflict2)uVar6;
          ptr_ = (child->_M_t).
                 super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 .
                 super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
                 ._M_head_impl;
          (child->_M_t).
          super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          .
          super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
          ._M_head_impl =
               (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                *)0x0;
          uVar5 = basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr
                            (&ptr_->super_olc_node_header,LEAF);
          *(uintptr_t *)((long)&this->children + (ulong)uVar6 * 8) = uVar5;
          this->field_0x20 = children_count_ + '\x01';
          return;
        }
        lVar1 = uVar7 * 8;
        uVar7 = uVar7 + 1;
      } while (*(long *)((long)&this->children + lVar1) != 0);
      __assert_fail("children.pointer_array[j] != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x905,
                    "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                   );
    }
    __assert_fail("children.pointer_array[i] == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x903,
                  "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
                 );
  }
  __assert_fail("child_indexes[key_byte] == empty_child",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x89b,
                "void unodb::detail::basic_inode_48<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::add_to_nonfull(db_leaf_unique_ptr &&, tree_depth_type, std::uint8_t) [ArtPolicy = unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>]"
               );
}

Assistant:

constexpr void add_to_nonfull(db_leaf_unique_ptr &&child,
                                tree_depth_type depth,
                                std::uint8_t children_count_) noexcept {
    UNODB_DETAIL_ASSERT(this->children_count == children_count_);
    UNODB_DETAIL_ASSERT(children_count_ >= parent_class::min_size);
    UNODB_DETAIL_ASSERT(children_count_ < parent_class::capacity);

    const auto key_byte = static_cast<uint8_t>(child->get_key_view()[depth]);
    UNODB_DETAIL_ASSERT(child_indexes[key_byte] == empty_child);
    unsigned i{0};
#ifdef UNODB_DETAIL_SSE4_2
    const auto nullptr_vector = _mm_setzero_si128();
    while (true) {
      const auto ptr_vec0 = _mm_load_si128(&children.pointer_vector[i]);
      const auto ptr_vec1 = _mm_load_si128(&children.pointer_vector[i + 1]);
      const auto ptr_vec2 = _mm_load_si128(&children.pointer_vector[i + 2]);
      const auto ptr_vec3 = _mm_load_si128(&children.pointer_vector[i + 3]);
      const auto vec0_cmp = _mm_cmpeq_epi64(ptr_vec0, nullptr_vector);
      const auto vec1_cmp = _mm_cmpeq_epi64(ptr_vec1, nullptr_vector);
      const auto vec2_cmp = _mm_cmpeq_epi64(ptr_vec2, nullptr_vector);
      const auto vec3_cmp = _mm_cmpeq_epi64(ptr_vec3, nullptr_vector);
      // OK to treat 64-bit comparison result as 32-bit vector: we need to find
      // the first 0xFF only.
      const auto vec01_cmp = _mm_packs_epi32(vec0_cmp, vec1_cmp);
      const auto vec23_cmp = _mm_packs_epi32(vec2_cmp, vec3_cmp);
      const auto vec_cmp = _mm_packs_epi32(vec01_cmp, vec23_cmp);
      const auto cmp_mask =
          static_cast<std::uint64_t>(_mm_movemask_epi8(vec_cmp));
      if (cmp_mask != 0) {
        i = (i << 1U) + (((detail::ctz(cmp_mask)) + 1U) >> 1U);
        break;
      }
      i += 4;
    }
#elif defined(UNODB_DETAIL_AVX2)
    const auto nullptr_vector = _mm256_setzero_si256();
    while (true) {
      const auto ptr_vec0 = _mm256_load_si256(&children.pointer_vector[i]);
      const auto ptr_vec1 = _mm256_load_si256(&children.pointer_vector[i + 1]);
      const auto ptr_vec2 = _mm256_load_si256(&children.pointer_vector[i + 2]);
      const auto ptr_vec3 = _mm256_load_si256(&children.pointer_vector[i + 3]);
      const auto vec0_cmp = _mm256_cmpeq_epi64(ptr_vec0, nullptr_vector);
      const auto vec1_cmp = _mm256_cmpeq_epi64(ptr_vec1, nullptr_vector);
      const auto vec2_cmp = _mm256_cmpeq_epi64(ptr_vec2, nullptr_vector);
      const auto vec3_cmp = _mm256_cmpeq_epi64(ptr_vec3, nullptr_vector);
      const auto interleaved_vec01_cmp = _mm256_packs_epi32(vec0_cmp, vec1_cmp);
      const auto interleaved_vec23_cmp = _mm256_packs_epi32(vec2_cmp, vec3_cmp);
      const auto doubly_interleaved_vec_cmp =
          _mm256_packs_epi32(interleaved_vec01_cmp, interleaved_vec23_cmp);
      if (!_mm256_testz_si256(doubly_interleaved_vec_cmp,
                              doubly_interleaved_vec_cmp)) {
        const auto vec01_cmp =
            _mm256_permute4x64_epi64(interleaved_vec01_cmp, 0b11'01'10'00);
        const auto vec23_cmp =
            _mm256_permute4x64_epi64(interleaved_vec23_cmp, 0b11'01'10'00);
        const auto interleaved_vec_cmp =
            _mm256_packs_epi32(vec01_cmp, vec23_cmp);
        const auto vec_cmp =
            _mm256_permute4x64_epi64(interleaved_vec_cmp, 0b11'01'10'00);
        const auto cmp_mask =
            static_cast<std::uint64_t>(_mm256_movemask_epi8(vec_cmp));
        i = (i << 2U) + (detail::ctz(cmp_mask) >> 1U);
        break;
      }
      i += 4;
    }
#elif defined(__aarch64__)
    const auto nullptr_vector = vdupq_n_u64(0);
    while (true) {
      const auto ptr_vec0 = children.pointer_vector[i];
      const auto ptr_vec1 = children.pointer_vector[i + 1];
      const auto ptr_vec2 = children.pointer_vector[i + 2];
      const auto ptr_vec3 = children.pointer_vector[i + 3];
      const auto vec0_cmp = vceqq_u64(nullptr_vector, ptr_vec0);
      const auto vec1_cmp = vceqq_u64(nullptr_vector, ptr_vec1);
      const auto vec2_cmp = vceqq_u64(nullptr_vector, ptr_vec2);
      const auto vec3_cmp = vceqq_u64(nullptr_vector, ptr_vec3);
      const auto narrowed_cmp0 = vshrn_n_u64(vec0_cmp, 4);
      const auto narrowed_cmp1 = vshrn_n_u64(vec1_cmp, 4);
      const auto narrowed_cmp2 = vshrn_n_u64(vec2_cmp, 4);
      const auto narrowed_cmp3 = vshrn_n_u64(vec3_cmp, 4);
      const auto cmp01 = vcombine_u32(narrowed_cmp0, narrowed_cmp1);
      const auto cmp23 = vcombine_u32(narrowed_cmp2, narrowed_cmp3);
      // NOLINTNEXTLINE(misc-const-correctness)
      const auto narrowed_cmp01 = vshrn_n_u32(cmp01, 4);
      // NOLINTNEXTLINE(misc-const-correctness)
      const auto narrowed_cmp23 = vshrn_n_u32(cmp23, 4);
      const auto cmp = vcombine_u16(narrowed_cmp01, narrowed_cmp23);
      // NOLINTNEXTLINE(misc-const-correctness)
      const auto narrowed_cmp = vshrn_n_u16(cmp, 4);
      const auto scalar_pos =
          // NOLINTNEXTLINE(misc-const-correctness)
          vget_lane_u64(vreinterpret_u64_u8(narrowed_cmp), 0);
      if (scalar_pos != 0) {
        i = (i << 1U) + static_cast<unsigned>(detail::ctz(scalar_pos) >> 3U);
        break;
      }
      i += 4;
    }
#else   // #ifdef UNODB_DETAIL_X86_64
    node_ptr child_ptr;
    while (true) {
      child_ptr = children.pointer_array[i];
      if (child_ptr == nullptr) break;
      UNODB_DETAIL_ASSERT(i < 255);
      ++i;
    }
#endif  // #ifdef UNODB_DETAIL_X86_64

    UNODB_DETAIL_ASSUME(i < parent_class::capacity);

#ifndef NDEBUG
    UNODB_DETAIL_ASSERT(children.pointer_array[i] == nullptr);
    for (unsigned j = 0; j < i; ++j)
      UNODB_DETAIL_ASSERT(children.pointer_array[j] != nullptr);
#endif

    child_indexes[key_byte] = static_cast<std::uint8_t>(i);
    children.pointer_array[i] = node_ptr{child.release(), node_type::LEAF};
    this->children_count = children_count_ + 1U;
  }